

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

void yy_1_integer(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  
  pPVar1 = PVIP_node_new_intf(&G->data,PVIP_NODE_INT,yytext,(long)yyleng,2);
  G->ss = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_1_integer(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define i G->val[-1]
  yyprintf((stderr, "do yy_1_integer"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {\n\
    yy = PVIP_node_new_intf(&(G->data), PVIP_NODE_INT, yytext, yyleng, 2);\n\
}\n"));
  
    yy = PVIP_node_new_intf(&(G->data), PVIP_NODE_INT, yytext, yyleng, 2);
;
#undef i
}